

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void jx9RegisterBuiltInConstant(jx9_vm *pVm)

{
  char cVar1;
  ProcConstant xExpand;
  char *pcVar2;
  char *pcVar3;
  ushort **ppuVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  SyString local_40;
  
  lVar6 = 0;
  do {
    if (pVm->nMagic != 0xdead2bad) {
      pcVar9 = aBuiltIn[lVar6].zName;
      xExpand = aBuiltIn[lVar6].xExpand;
      pcVar3 = pcVar9;
      if (*pcVar9 != '\0') {
        pcVar2 = pcVar9 + 2;
        do {
          pcVar3 = pcVar2;
          if (pcVar3[-1] == '\0') {
            pcVar3 = pcVar3 + -1;
            goto LAB_0012b316;
          }
          if (*pcVar3 == '\0') goto LAB_0012b316;
          if (pcVar3[1] == '\0') {
            pcVar3 = pcVar3 + 1;
            goto LAB_0012b316;
          }
          pcVar2 = pcVar3 + 4;
        } while (pcVar3[2] != '\0');
        pcVar3 = pcVar3 + 2;
      }
LAB_0012b316:
      uVar5 = (int)pcVar3 - (int)pcVar9;
      local_40.zString = pcVar9;
      local_40.nByte = uVar5;
      if (uVar5 != 0) {
        do {
          cVar1 = *pcVar9;
          if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
             (ppuVar4 = __ctype_b_loc(),
             (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) == 0)) goto LAB_0012b342;
          pcVar9 = pcVar9 + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
        uVar5 = 0;
      }
LAB_0012b342:
      bVar10 = uVar5 == 0;
      local_40.nByte = uVar5;
      local_40.zString = pcVar9;
      if (!bVar10) {
        uVar8 = (ulong)(uVar5 - 1);
        cVar1 = pcVar9[uVar8];
        if ((ulong)(long)cVar1 < 0xffffffffffffffc0) {
          ppuVar4 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0) {
            while( true ) {
              uVar7 = (uint)uVar8;
              bVar10 = uVar7 == 0;
              if (bVar10) break;
              uVar5 = uVar5 - 1;
              uVar8 = (ulong)(uVar7 - 1);
              local_40.nByte = uVar5;
              if ((0xffffffffffffffbf < (ulong)(long)pcVar9[uVar8]) ||
                 (local_40.nByte = uVar7,
                 (*(byte *)((long)*ppuVar4 + (long)pcVar9[uVar8] * 2 + 1) & 0x20) == 0))
              goto LAB_0012b37a;
            }
            local_40.nByte = 0;
            goto LAB_0012b37a;
          }
        }
        bVar10 = false;
        local_40.nByte = uVar5;
      }
LAB_0012b37a:
      if ((xExpand != (ProcConstant)0x0) && (!bVar10)) {
        jx9VmRegisterConstant(pVm,&local_40,xExpand,pVm);
      }
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == 0x7a) {
      return;
    }
  } while( true );
}

Assistant:

JX9_PRIVATE void jx9RegisterBuiltInConstant(jx9_vm *pVm)
{
	sxu32 n;
	/* 
	 * Note that all built-in constants have access to the jx9 virtual machine
	 * that trigger the constant invocation as their private data.
	 */
	for( n = 0 ; n < SX_ARRAYSIZE(aBuiltIn) ; ++n ){
		jx9_create_constant(&(*pVm), aBuiltIn[n].zName, aBuiltIn[n].xExpand, &(*pVm));
	}
}